

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int thread_peak_read_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  uint64_t uVar1;
  uint64_t *in_RCX;
  ulong *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t copylen;
  uint64_t result;
  int ret;
  tsd_t *in_stack_ffffffffffffffb0;
  ulong __n;
  tsd_t *in_stack_ffffffffffffffc0;
  int local_34;
  
  if ((in_R9 == 0) && (in_stack_00000008 == 0)) {
    duckdb_je_peak_event_update(in_stack_ffffffffffffffc0);
    uVar1 = duckdb_je_peak_event_max(in_stack_ffffffffffffffb0);
    if ((in_RCX != (uint64_t *)0x0) && (in_R8 != (ulong *)0x0)) {
      if (*in_R8 != 8) {
        if (*in_R8 < 8) {
          __n = *in_R8;
        }
        else {
          __n = 8;
        }
        memcpy(in_RCX,&stack0xffffffffffffffc0,__n);
        *in_R8 = __n;
        return 0x16;
      }
      *in_RCX = uVar1;
    }
    local_34 = 0;
  }
  else {
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int
thread_peak_read_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	if (!config_stats) {
		return ENOENT;
	}
	READONLY();
	peak_event_update(tsd);
	uint64_t result = peak_event_max(tsd);
	READ(result, uint64_t);
	ret = 0;
label_return:
	return ret;
}